

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O1

size_t zdd_nodecount_mark(ZDD zdd)

{
  uint8_t *puVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  
  sVar4 = 0;
  while( true ) {
    puVar1 = nodes->data;
    lVar3 = (zdd & 0xffffffffff) * 0x10;
    if ((*(ulong *)(puVar1 + lVar3) & 0x1000000000000000) != 0) break;
    *(ulong *)(puVar1 + lVar3) = *(ulong *)(puVar1 + lVar3) | 0x1000000000000000;
    sVar2 = zdd_nodecount_mark(*(ulong *)(puVar1 + lVar3 + 8) & 0xffffffffff);
    zdd = *(ulong *)(puVar1 + lVar3) & 0x800000ffffffffff;
    sVar4 = sVar2 + 1 + sVar4;
  }
  return sVar4;
}

Assistant:

static size_t
zdd_nodecount_mark(ZDD zdd)
{
    // Note: the True/False leaf can be marked/unmarked, as buckets 0--1 are unused
    zddnode_t n = ZDD_GETNODE(zdd);
    if (zddnode_getmark(n)) return 0;
    zddnode_setmark(n, 1);
    return 1 + zdd_nodecount_mark(zddnode_getlow(n)) + zdd_nodecount_mark(zddnode_gethigh(n));
}